

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

Vector3 GetCameraUp(Camera *camera)

{
  Vector3 VVar1;
  
  VVar1 = Vector3Normalize(camera->up);
  return VVar1;
}

Assistant:

Vector3 GetCameraUp(Camera *camera)
{
    return Vector3Normalize(camera->up);
}